

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoll.c
# Opt level: O0

int ffgcll(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,int nultyp,
          char nulval,char *array,char *nularray,int *anynul,int *status)

{
  int iVar1;
  size_t in_R8;
  int in_R9D;
  char in_stack_00000008;
  long in_stack_00000010;
  void *in_stack_00000018;
  undefined4 *in_stack_00000020;
  int *in_stack_00000028;
  uchar *buffptr;
  uchar buffer [28800];
  char snull [20];
  char message [81];
  char tform [20];
  double zero;
  double scale;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG tnull;
  LONGLONG readptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  long ntodo;
  long incre;
  long twidth;
  int nulcheck;
  int ii;
  int hdutype;
  int maxelem;
  int tcode;
  double dtemp;
  int *status_00;
  uchar *values;
  undefined1 *incre_00;
  undefined1 *nvals;
  undefined1 *byteloc;
  fitsfile *fptr_00;
  size_t local_7260;
  size_t local_7258;
  char *local_7220;
  char local_7218 [12];
  int in_stack_ffffffffffff8df4;
  LONGLONG in_stack_ffffffffffff8df8;
  LONGLONG in_stack_ffffffffffff8e00;
  LONGLONG in_stack_ffffffffffff8e08;
  int in_stack_ffffffffffff8e14;
  fitsfile *in_stack_ffffffffffff8e18;
  double *in_stack_ffffffffffff8e30;
  double *in_stack_ffffffffffff8e38;
  char *in_stack_ffffffffffff8e40;
  long *in_stack_ffffffffffff8e48;
  int *in_stack_ffffffffffff8e50;
  int *in_stack_ffffffffffff8e58;
  LONGLONG *in_stack_ffffffffffff8e60;
  LONGLONG *in_stack_ffffffffffff8e68;
  long *in_stack_ffffffffffff8e70;
  LONGLONG *in_stack_ffffffffffff8e78;
  LONGLONG *in_stack_ffffffffffff8e80;
  int *in_stack_ffffffffffff8e88;
  LONGLONG *in_stack_ffffffffffff8e90;
  char *in_stack_ffffffffffff8e98;
  int *in_stack_ffffffffffff8ea0;
  char local_178 [96];
  undefined1 local_118 [32];
  uchar local_f8 [8];
  int local_f0 [2];
  long local_e8;
  size_t local_e0;
  long local_d8;
  long local_d0;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  size_t local_a0;
  long local_98;
  undefined1 local_90 [12];
  int local_84;
  int local_80;
  fitsfile local_78;
  int local_64;
  size_t local_60;
  int local_34;
  
  if ((*in_stack_00000028 < 1) && (in_R8 != 0)) {
    if (in_stack_00000020 != (undefined4 *)0x0) {
      *in_stack_00000020 = 0;
    }
    local_64 = in_R9D;
    local_60 = in_R8;
    if (in_R9D == 2) {
      memset(in_stack_00000018,0,in_R8);
    }
    incre_00 = local_118;
    status_00 = local_f0;
    values = local_f8;
    nvals = local_90;
    byteloc = &local_78.field_0x4;
    fptr_00 = &local_78;
    iVar1 = ffgcprll(in_stack_ffffffffffff8e18,in_stack_ffffffffffff8e14,in_stack_ffffffffffff8e08,
                     in_stack_ffffffffffff8e00,in_stack_ffffffffffff8df8,in_stack_ffffffffffff8df4,
                     in_stack_ffffffffffff8e30,in_stack_ffffffffffff8e38,in_stack_ffffffffffff8e40,
                     in_stack_ffffffffffff8e48,in_stack_ffffffffffff8e50,in_stack_ffffffffffff8e58,
                     in_stack_ffffffffffff8e60,in_stack_ffffffffffff8e68,in_stack_ffffffffffff8e70,
                     in_stack_ffffffffffff8e78,in_stack_ffffffffffff8e80,in_stack_ffffffffffff8e88,
                     in_stack_ffffffffffff8e90,in_stack_ffffffffffff8e98,in_stack_ffffffffffff8ea0);
    if (iVar1 < 1) {
      if (local_78._4_4_ == 0xe) {
        local_84 = local_64;
        if ((local_64 == 1) && (in_stack_00000008 == '\0')) {
          local_84 = 0;
        }
        local_e8 = 0;
        local_d8 = 0;
        local_a0 = local_60;
        local_e0 = local_a0;
        while (local_a0 = local_e0, local_e0 = local_a0, local_a0 != 0) {
          if ((long)local_a0 < (long)local_78.HDUposition) {
            local_7258 = local_a0;
          }
          else {
            local_7258 = (size_t)local_78.HDUposition;
          }
          if ((long)local_7258 < local_a8 - local_b8) {
            local_7260 = local_7258;
          }
          else {
            local_7260 = local_a8 - local_b8;
          }
          local_a0 = local_7260;
          local_c0 = local_b0 + local_d0 * local_d8 + local_b8 * local_98;
          ffgi1b(fptr_00,(LONGLONG)byteloc,(long)nvals,(long)incre_00,values,status_00);
          local_7220 = local_7218;
          for (local_80 = 0; (long)local_80 < (long)local_a0; local_80 = local_80 + 1) {
            if (*local_7220 == 'T') {
              *(undefined1 *)(in_stack_00000010 + local_e8) = 1;
            }
            else if (*local_7220 == 'F') {
              *(undefined1 *)(in_stack_00000010 + local_e8) = 0;
            }
            else if (*local_7220 == '\0') {
              *(char *)(in_stack_00000010 + local_e8) = in_stack_00000008;
              if (in_stack_00000020 != (undefined4 *)0x0) {
                *in_stack_00000020 = 1;
              }
              if (local_84 == 2) {
                *(undefined1 *)((long)in_stack_00000018 + local_e8) = 1;
              }
            }
            else if (*local_7220 == '\x01') {
              *(undefined1 *)(in_stack_00000010 + local_e8) = 0x31;
            }
            else {
              *(char *)(in_stack_00000010 + local_e8) = *local_7220;
            }
            local_e8 = local_e8 + 1;
            local_7220 = local_7220 + 1;
          }
          if (0 < *in_stack_00000028) {
            local_78.Fptr = (FITSfile *)(double)local_e8;
            snprintf(local_178,0x51,
                     "Error reading elements %.0f thruough %.0f of logical array (ffgcl).",
                     (double)local_78.Fptr + 1.0,(double)local_78.Fptr + (double)(long)local_a0);
            ffpmsg((char *)0x1a695b);
            return *in_stack_00000028;
          }
          local_e0 = local_e0 - local_a0;
          if ((local_e0 != 0) && (local_b8 = local_a0 + local_b8, local_b8 == local_a8)) {
            local_b8 = 0;
            local_d8 = local_d8 + 1;
          }
        }
        local_34 = *in_stack_00000028;
      }
      else {
        *in_stack_00000028 = 0x136;
        local_34 = 0x136;
      }
    }
    else {
      local_34 = *in_stack_00000028;
    }
  }
  else {
    local_34 = *in_stack_00000028;
  }
  return local_34;
}

Assistant:

int ffgcll( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
            LONGLONG  firstelem, /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            char nulval,      /* I - value for null pixels if nultyp = 1     */
            char *array,      /* O - array of values                         */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of logical values from a column in the current FITS HDU.
*/
{
    double dtemp;
    int tcode, maxelem, hdutype, ii, nulcheck;
    long twidth, incre;
    long ntodo;
    LONGLONG repeat, startpos, elemnum, readptr, tnull, rowlen, rownum, remain, next;
    double scale, zero;
    char tform[20];
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value  */
    unsigned char buffer[DBUFFSIZE], *buffptr;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    if (anynul)
       *anynul = 0;

    if (nultyp == 2)      
       memset(nularray, 0, (size_t) nelem);   /* initialize nullarray */

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, 0, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

    if (tcode != TLOGICAL)   
        return(*status = NOT_LOGICAL_COL);
 
    /*------------------------------------------------------------------*/
    /*  Decide whether to check for null values in the input FITS file: */
    /*------------------------------------------------------------------*/
    nulcheck = nultyp; /* by default, check for null values in the FITS file */

    if (nultyp == 1 && nulval == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    /*---------------------------------------------------------------------*/
    /*  Now read the logical values from the FITS column.                  */
    /*---------------------------------------------------------------------*/

    remain = nelem;           /* remaining number of values to read */
    next = 0;                 /* next element in array to be read   */
    rownum = 0;               /* row number, relative to firstrow   */
    ntodo = (long) remain;           /* max number of elements to read at one time */

    while (ntodo)
    {
      /*
         limit the number of pixels to read at one time to the number that
         remain in the current vector.    
      */
      ntodo = (long) minvalue(ntodo, maxelem);      
      ntodo = (long) minvalue(ntodo, (repeat - elemnum));

      readptr = startpos + (rowlen * rownum) + (elemnum * incre);

      ffgi1b(fptr, readptr, ntodo, incre, buffer, status);

      /* convert from T or F to 1 or 0 */
      buffptr = buffer;
      for (ii = 0; ii < ntodo; ii++, next++, buffptr++)
      {
        if (*buffptr == 'T')
          array[next] = 1;
        else if (*buffptr =='F') 
          array[next] = 0;
        else if (*buffptr == 0)
        {
          array[next] = nulval;  /* set null values to input nulval */
          if (anynul)
              *anynul = 1;

          if (nulcheck == 2)
          {
            nularray[next] = 1;  /* set null flags */
          }
        }
        else  /* some other illegal character; return the char value */
        {
          if (*buffptr == 1) {
            /* this is an unfortunate case where the illegal value is the same
               as what we set True values to, so set the value to the character '1'
               instead, which has ASCII value 49.  */
            array[next] = 49;
          } else {
            array[next] = (char) *buffptr;
          }
        }
      }

      if (*status > 0)  /* test for error during previous read operation */
      {
	dtemp = (double) next;
        snprintf(message,FLEN_ERRMSG,
          "Error reading elements %.0f thruough %.0f of logical array (ffgcl).",
           dtemp+1., dtemp + ntodo);
        ffpmsg(message);
        return(*status);
      }

      /*--------------------------------------------*/
      /*  increment the counters for the next loop  */
      /*--------------------------------------------*/
      remain -= ntodo;
      if (remain)
      {
        elemnum += ntodo;

        if (elemnum == repeat)  /* completed a row; start on later row */
          {
            elemnum = 0;
            rownum++;
          }
      }
      ntodo = (long) remain;  /* this is the maximum number to do in next loop */

    }  /*  End of main while Loop  */

    return(*status);
}